

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

ptrdiff_t mp_check_binl(char *cur,char *end)

{
  uint32_t hsize;
  uint8_t c;
  char *end_local;
  char *cur_local;
  
  end_local = cur;
  cur_local._7_1_ = mp_load_u8(&end_local);
  if (end <= end_local) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0xa3f,"ptrdiff_t mp_check_binl(const char *, const char *)");
  }
  if (mp_type_hint[cur_local._7_1_] == MP_BIN) {
    if ((0xc3 < cur_local._7_1_) && (cur_local._7_1_ < 199)) {
      return (ulong)(uint)(1 << (cur_local._7_1_ & 3)) - ((long)end - (long)end_local);
    }
    __assert_fail("c >= 0xc4 && c <= 0xc6",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0xa42,"ptrdiff_t mp_check_binl(const char *, const char *)");
  }
  __assert_fail("mp_typeof(c) == MP_BIN",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0xa40,"ptrdiff_t mp_check_binl(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_binl(const char *cur, const char *end)
{
	uint8_t c = mp_load_u8(&cur);
	assert(cur < end);
	assert(mp_typeof(c) == MP_BIN);

	assert(c >= 0xc4 && c <= 0xc6); /* must be checked above by mp_typeof */
	uint32_t hsize = 1U << (c & 0x3); /* 0xc4->1, 0xc5->2, 0xc6->4 */
	return hsize - (end - cur);
}